

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::dense_hashtable(dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                  *this,size_type expected_max_items_in_table,HashA *hf,equal_to<A> *eql,
                 Identity *ext,SetKey *set,libc_allocator_with_realloc<A> *alloc)

{
  long in_RSI;
  dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
  *in_RDI;
  alloc_impl<google::libc_allocator_with_realloc<A>_> *in_stack_ffffffffffffff78;
  ValInfo *in_stack_ffffffffffffff80;
  equal_to<A> *in_stack_ffffffffffffff88;
  SetKey *in_stack_ffffffffffffff90;
  Identity *in_stack_ffffffffffffff98;
  KeyInfo *in_stack_ffffffffffffffa0;
  size_type sVar1;
  size_type *min_buckets_wanted;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  
  Settings::Settings((Settings *)in_stack_ffffffffffffff80,(hasher *)in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  min_buckets_wanted = &in_RDI->num_buckets;
  if (in_RSI == 0) {
    sVar1 = 0x20;
  }
  else {
    sVar1 = sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::min_buckets
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       (size_type)min_buckets_wanted);
  }
  *min_buckets_wanted = sVar1;
  alloc_impl<google::libc_allocator_with_realloc<A>_>::alloc_impl
            ((alloc_impl<google::libc_allocator_with_realloc<A>_> *)in_stack_ffffffffffffff80,
             (libc_allocator_with_realloc<A> *)in_stack_ffffffffffffff78);
  ValInfo::ValInfo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  alloc_impl<google::libc_allocator_with_realloc<A>_>::~alloc_impl
            ((alloc_impl<google::libc_allocator_with_realloc<A>_> *)0x10a3e2b);
  in_RDI->table = (pointer)0x0;
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)in_RDI,
             (size_type)in_stack_ffffffffffffff78);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }